

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlainObjectBase.h
# Opt level: O2

Matrix<float,__1,__1,_0,__1,__1> * __thiscall
Eigen::PlainObjectBase<Eigen::Matrix<float,-1,-1,0,-1,-1>>::
_set_noalias<Eigen::Product<Eigen::Transpose<Eigen::Matrix<float,_1,_1,0,_1,_1>const>,Eigen::Matrix<float,_1,_1,0,_1,_1>,0>>
          (PlainObjectBase<Eigen::Matrix<float,_1,_1,0,_1,_1>> *this,
          DenseBase<Eigen::Product<Eigen::Transpose<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>_>,_Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0>_>
          *other)

{
  ActualDstType actualDst;
  assign_op<float,_float> local_9;
  
  internal::
  Assignment<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_Eigen::Product<Eigen::Transpose<const_Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>_>,_Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_0>,_Eigen::internal::assign_op<float,_float>,_Eigen::internal::Dense2Dense,_void>
  ::run((Matrix<float,__1,__1,_0,__1,__1> *)this,(SrcXprType *)other,&local_9);
  return (Matrix<float,__1,__1,_0,__1,__1> *)this;
}

Assistant:

EIGEN_DEVICE_FUNC
    EIGEN_STRONG_INLINE Derived& _set_noalias(const DenseBase<OtherDerived>& other)
    {
      // I don't think we need this resize call since the lazyAssign will anyways resize
      // and lazyAssign will be called by the assign selector.
      //_resize_to_match(other);
      // the 'false' below means to enforce lazy evaluation. We don't use lazyAssign() because
      // it wouldn't allow to copy a row-vector into a column-vector.
      internal::call_assignment_no_alias(this->derived(), other.derived(), internal::assign_op<Scalar,typename OtherDerived::Scalar>());
      return this->derived();
    }